

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

void __thiscall
TxRequestTracker::Impl::RequestedTx(Impl *this,NodeId peer,uint256 *txhash,microseconds expiry)

{
  type *this_00;
  long *plVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  bool bVar6;
  iterator x;
  __node_ptr p_Var7;
  iterator x_00;
  key_type_conflict4 *pkVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->m_index).super_type;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_READY;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_long,_false>)(_Head_base<2UL,_unsigned_long,_false>)txhash;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = (uint256 *)peer;
  x = boost::multi_index::detail::
      ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
      ::find<std::tuple<long,bool,uint256_const&>>
                ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                  *)this_00,(tuple<long,_bool,_const_uint256_&> *)&local_50);
  if (x.node == (this->m_index).
                super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                .member) {
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_DELAYED;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)(_Head_base<2UL,_unsigned_long,_false>)txhash;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = (uint256 *)peer;
    x = boost::multi_index::detail::
        ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
        ::find<std::tuple<long,bool,uint256_const&>>
                  ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                    *)this_00,(tuple<long,_bool,_const_uint256_&> *)&local_50);
    if ((x.node == (this->m_index).
                   super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   .member) ||
       (*(ulong *)((long)&((x.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          .
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) >> 0x3e != 0)) goto LAB_00ae6687;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)0;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_BEST;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = txhash;
    x_00 = boost::multi_index::detail::
           ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
           ::lower_bound<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>
                     ((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                       *)this_00,&local_50);
    if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
         *)x_00.node !=
        (this->m_index).
        super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
        .member) {
      auVar4 = *(undefined1 (*) [16])
                ((long)&((x_00.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x10);
      auVar10[0] = -((txhash->super_base_blob<256U>).m_data._M_elems[0] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0])
      ;
      auVar10[1] = -((txhash->super_base_blob<256U>).m_data._M_elems[1] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[1])
      ;
      auVar10[2] = -((txhash->super_base_blob<256U>).m_data._M_elems[2] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[2])
      ;
      auVar10[3] = -((txhash->super_base_blob<256U>).m_data._M_elems[3] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[3])
      ;
      auVar10[4] = -((txhash->super_base_blob<256U>).m_data._M_elems[4] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[4])
      ;
      auVar10[5] = -((txhash->super_base_blob<256U>).m_data._M_elems[5] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[5])
      ;
      auVar10[6] = -((txhash->super_base_blob<256U>).m_data._M_elems[6] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[6])
      ;
      auVar10[7] = -((txhash->super_base_blob<256U>).m_data._M_elems[7] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[7])
      ;
      auVar10[8] = -((txhash->super_base_blob<256U>).m_data._M_elems[8] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[8])
      ;
      auVar10[9] = -((txhash->super_base_blob<256U>).m_data._M_elems[9] ==
                    ((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[9])
      ;
      auVar10[10] = -((txhash->super_base_blob<256U>).m_data._M_elems[10] ==
                     ((x_00.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [10]);
      auVar10[0xb] = -((txhash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      ((x_00.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0xb]);
      auVar10[0xc] = -((txhash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      ((x_00.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0xc]);
      auVar10[0xd] = -((txhash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      ((x_00.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0xd]);
      auVar10[0xe] = -((txhash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      ((x_00.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0xe]);
      auVar10[0xf] = -((txhash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      ((x_00.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0xf]);
      auVar9[0] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x10] == auVar4[0]);
      auVar9[1] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x11] == auVar4[1]);
      auVar9[2] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x12] == auVar4[2]);
      auVar9[3] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x13] == auVar4[3]);
      auVar9[4] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x14] == auVar4[4]);
      auVar9[5] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x15] == auVar4[5]);
      auVar9[6] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x16] == auVar4[6]);
      auVar9[7] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x17] == auVar4[7]);
      auVar9[8] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x18] == auVar4[8]);
      auVar9[9] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x19] == auVar4[9]);
      auVar9[10] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1a] == auVar4[10]);
      auVar9[0xb] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1b] == auVar4[0xb]);
      auVar9[0xc] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1c] == auVar4[0xc]);
      auVar9[0xd] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1d] == auVar4[0xd]);
      auVar9[0xe] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1e] == auVar4[0xe]);
      auVar9[0xf] = -((txhash->super_base_blob<256U>).m_data._M_elems[0x1f] == auVar4[0xf]);
      auVar9 = auVar9 & auVar10;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
        uVar5 = *(ulong *)((long)&((x_00.node)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  ).
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30);
        if (uVar5 >> 0x3d == 3) {
          Modify<(anonymous_namespace)::ByTxHash,TxRequestTracker::Impl::RequestedTx(long,uint256_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda((anonymous_namespace)::Announcement&)_2_>
                    (this,x_00.node);
        }
        else if ((uint)(uVar5 >> 0x3d) == 2) {
          pkVar8 = (key_type_conflict4 *)
                   (((x_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf +
                   0x28);
          p_Var7 = std::
                   _Hashtable<long,_std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_node(&(this->m_peerinfo)._M_h,
                                  *(ulong *)((long)&((x_00.node)->
                                                                                                        
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x28) %
                                  (this->m_peerinfo)._M_h._M_bucket_count,pkVar8,(__hash_code)pkVar8
                                 );
          puVar3 = (undefined8 *)
                   ((long)&(p_Var7->
                           super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                           ._M_storage._M_storage + 0x10);
          *puVar3 = *puVar3;
          plVar1 = (long *)((long)&(p_Var7->
                                   super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                                   ._M_storage._M_storage + 0x18);
          *plVar1 = *plVar1 - (ulong)((uint)((ulong)*(undefined8 *)
                                                     ((long)&((x_00.node)->
                                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) >> 0x3d) == 3);
          *(ulong *)((long)&((x_00.node)->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            ).
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x30) =
               (*(ulong *)((long)&((x_00.node)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  ).
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30) & 0x1fffffffffffffff) + 0x2000000000000000;
          bVar6 = boost::multi_index::detail::
                  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                  ::modify_(&this_00->super_type,(index_node_type *)x_00.node);
          if (!bVar6) {
            operator_delete(x_00.node,0x80);
            psVar2 = &(this->m_index).node_count;
            *psVar2 = *psVar2 - 1;
          }
          plVar1 = (long *)((long)&(p_Var7->
                                   super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                                   ._M_storage._M_storage + 0x10);
          *plVar1 = *plVar1 + (ulong)((*(ulong *)((long)&((x_00.node)->
                                                                                                                  
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) & 0xe000000000000000) ==
                                     0x8000000000000000);
          plVar1 = (long *)((long)&(p_Var7->
                                   super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                                   ._M_storage._M_storage + 0x18);
          *plVar1 = *plVar1 + (ulong)((*(ulong *)((long)&((x_00.node)->
                                                                                                                  
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) & 0xe000000000000000) ==
                                     0x6000000000000000);
        }
      }
    }
  }
  pkVar8 = (key_type_conflict4 *)
           (((x.node)->
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
            ).
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
            .
            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf + 0x28);
  p_Var7 = std::
           _Hashtable<long,_std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&(this->m_peerinfo)._M_h,
                          *(ulong *)((long)&((x.node)->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x28) %
                          (this->m_peerinfo)._M_h._M_bucket_count,pkVar8,(__hash_code)pkVar8);
  plVar1 = (long *)((long)&(p_Var7->
                           super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                           ._M_storage._M_storage + 0x10);
  *plVar1 = *plVar1 - (ulong)((uint)((ulong)*(undefined8 *)
                                             ((long)&((x.node)->
                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  .
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) >> 0x3d) == 4);
  plVar1 = (long *)((long)&(p_Var7->
                           super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                           ._M_storage._M_storage + 0x18);
  *plVar1 = *plVar1 - (ulong)((uint)((ulong)*(undefined8 *)
                                             ((long)&((x.node)->
                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  .
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) >> 0x3d) == 3);
  *(ulong *)((long)&((x.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    .
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x30)
       = *(ulong *)((long)&((x.node)->
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                           .
                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                           .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                   + 0x30) & 0x1fffffffffffffff | 0x6000000000000000;
  *(rep *)((long)&((x.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                  ).
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  .
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x20) =
       expiry.__r;
  bVar6 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::modify_(&this_00->super_type,x.node);
  if (!bVar6) {
    operator_delete(x.node,0x80);
    psVar2 = &(this->m_index).node_count;
    *psVar2 = *psVar2 - 1;
  }
  plVar1 = (long *)((long)&(p_Var7->
                           super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                           ._M_storage._M_storage + 0x10);
  *plVar1 = *plVar1 + (ulong)((*(ulong *)((long)&((x.node)->
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                                 ).
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                 .
                                                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                 .
                                                 super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                 .space.data_ + 0x30) & 0xe000000000000000) ==
                             0x8000000000000000);
  plVar1 = (long *)((long)&(p_Var7->
                           super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                           ._M_storage._M_storage + 0x18);
  *plVar1 = *plVar1 + (ulong)((*(ulong *)((long)&((x.node)->
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                                 ).
                                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                 .
                                                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                 .
                                                 super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                 .space.data_ + 0x30) & 0xe000000000000000) ==
                             0x6000000000000000);
LAB_00ae6687:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RequestedTx(NodeId peer, const uint256& txhash, std::chrono::microseconds expiry)
    {
        auto it = m_index.get<ByPeer>().find(ByPeerView{peer, true, txhash});
        if (it == m_index.get<ByPeer>().end()) {
            // There is no CANDIDATE_BEST announcement, look for a _READY or _DELAYED instead. If the caller only
            // ever invokes RequestedTx with the values returned by GetRequestable, and no other non-const functions
            // other than ForgetTxHash and GetRequestable in between, this branch will never execute (as txhashes
            // returned by GetRequestable always correspond to CANDIDATE_BEST announcements).

            it = m_index.get<ByPeer>().find(ByPeerView{peer, false, txhash});
            if (it == m_index.get<ByPeer>().end() || (it->GetState() != State::CANDIDATE_DELAYED &&
                                                      it->GetState() != State::CANDIDATE_READY)) {
                // There is no CANDIDATE announcement tracked for this peer, so we have nothing to do. Either this
                // txhash wasn't tracked at all (and the caller should have called ReceivedInv), or it was already
                // requested and/or completed for other reasons and this is just a superfluous RequestedTx call.
                return;
            }

            // Look for an existing CANDIDATE_BEST or REQUESTED with the same txhash. We only need to do this if the
            // found announcement had a different state than CANDIDATE_BEST. If it did, invariants guarantee that no
            // other CANDIDATE_BEST or REQUESTED can exist.
            auto it_old = m_index.get<ByTxHash>().lower_bound(ByTxHashView{txhash, State::CANDIDATE_BEST, 0});
            if (it_old != m_index.get<ByTxHash>().end() && it_old->m_txhash == txhash) {
                if (it_old->GetState() == State::CANDIDATE_BEST) {
                    // The data structure's invariants require that there can be at most one CANDIDATE_BEST or one
                    // REQUESTED announcement per txhash (but not both simultaneously), so we have to convert any
                    // existing CANDIDATE_BEST to another CANDIDATE_* when constructing another REQUESTED.
                    // It doesn't matter whether we pick CANDIDATE_READY or _DELAYED here, as SetTimePoint()
                    // will correct it at GetRequestable() time. If time only goes forward, it will always be
                    // _READY, so pick that to avoid extra work in SetTimePoint().
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::CANDIDATE_READY); });
                } else if (it_old->GetState() == State::REQUESTED) {
                    // As we're no longer waiting for a response to the previous REQUESTED announcement, convert it
                    // to COMPLETED. This also helps guaranteeing progress.
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::COMPLETED); });
                }
            }
        }

        Modify<ByPeer>(it, [expiry](Announcement& ann) {
            ann.SetState(State::REQUESTED);
            ann.m_time = expiry;
        });
    }